

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_nls_sim.c
# Opt level: O1

int IDASetNonlinearSolverSensSim(void *ida_mem,SUNNonlinearSolver NLS)

{
  SUNNonlinearSolver_Ops p_Var1;
  int iVar2;
  long lVar3;
  int iVar4;
  int error_code;
  char *msgfmt;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    iVar4 = -0x14;
    ida_mem = (IDAMem)0x0;
    error_code = -0x14;
    iVar2 = 0x34;
  }
  else if (NLS == (SUNNonlinearSolver)0x0) {
    msgfmt = "NLS must be non-NULL";
    iVar4 = -0x16;
    ida_mem = (IDAMem)0x0;
    error_code = -0x16;
    iVar2 = 0x3c;
  }
  else {
    p_Var1 = NLS->ops;
    if (((p_Var1->gettype == (_func_SUNNonlinearSolver_Type_SUNNonlinearSolver *)0x0) ||
        (p_Var1->solve ==
         (_func_int_SUNNonlinearSolver_N_Vector_N_Vector_N_Vector_sunrealtype_int_void_ptr *)0x0))
       || (p_Var1->setsysfn == (_func_SUNErrCode_SUNNonlinearSolver_SUNNonlinSolSysFn *)0x0)) {
      msgfmt = "NLS does not support required operations";
      iVar4 = -0x16;
      error_code = -0x16;
      iVar2 = 0x45;
    }
    else {
      iVar2 = SUNNonlinSolGetType(NLS);
      if (iVar2 == 0) {
        if (*(int *)((long)ida_mem + 0x9c) == 0) {
          msgfmt = "Illegal attempt to call before calling IDASensInit.";
          iVar4 = -0x16;
          error_code = -0x16;
          iVar2 = 0x55;
        }
        else if (*(int *)((long)ida_mem + 0xa4) == 1) {
          if ((*(long *)((long)ida_mem + 0x6d8) != 0) && (*(int *)((long)ida_mem + 0x6e0) != 0)) {
            SUNNonlinSolFree();
          }
          *(SUNNonlinearSolver *)((long)ida_mem + 0x6d8) = NLS;
          *(undefined4 *)((long)ida_mem + 0x6e0) = 0;
          iVar2 = SUNNonlinSolSetSysFn(NLS,idaNlsResidualSensSim);
          if (iVar2 == 0) {
            iVar2 = SUNNonlinSolSetConvTestFn
                              (*(undefined8 *)((long)ida_mem + 0x6d8),idaNlsConvTestSensSim,ida_mem)
            ;
            if (iVar2 == 0) {
              iVar2 = SUNNonlinSolSetMaxIters(*(undefined8 *)((long)ida_mem + 0x6d8),4);
              if (iVar2 == 0) {
                if (*(int *)((long)ida_mem + 0x728) == 0) {
                  lVar3 = N_VNewEmpty_SensWrapper(*(int *)((long)ida_mem + 0xa0) + 1,*ida_mem);
                  *(long *)((long)ida_mem + 0x6f8) = lVar3;
                  if (lVar3 == 0) {
                    msgfmt = "A memory request failed.";
                    iVar4 = -0x15;
                    error_code = -0x15;
                    iVar2 = 0x92;
                    goto LAB_001289c0;
                  }
                  lVar3 = N_VNewEmpty_SensWrapper(*(int *)((long)ida_mem + 0xa0) + 1,*ida_mem);
                  *(long *)((long)ida_mem + 0x700) = lVar3;
                  if (lVar3 == 0) {
                    N_VDestroy(*(undefined8 *)((long)ida_mem + 0x6f8));
                    msgfmt = "A memory request failed.";
                    iVar4 = -0x15;
                    error_code = -0x15;
                    iVar2 = 0x9c;
                    goto LAB_001289c0;
                  }
                  lVar3 = N_VNewEmpty_SensWrapper(*(int *)((long)ida_mem + 0xa0) + 1,*ida_mem);
                  *(long *)((long)ida_mem + 0x708) = lVar3;
                  if (lVar3 == 0) {
                    N_VDestroy(*(undefined8 *)((long)ida_mem + 0x6f8));
                    N_VDestroy(*(undefined8 *)((long)ida_mem + 0x700));
                    msgfmt = "A memory request failed.";
                    iVar4 = -0x15;
                    error_code = -0x15;
                    iVar2 = 0xa7;
                    goto LAB_001289c0;
                  }
                  *(undefined4 *)((long)ida_mem + 0x728) = 1;
                }
                **(undefined8 **)**(undefined8 **)((long)ida_mem + 0x6f8) =
                     *(undefined8 *)((long)ida_mem + 0x290);
                **(undefined8 **)**(undefined8 **)((long)ida_mem + 0x700) =
                     *(undefined8 *)((long)ida_mem + 0x2c0);
                **(undefined8 **)**(undefined8 **)((long)ida_mem + 0x708) =
                     *(undefined8 *)((long)ida_mem + 0x278);
                iVar2 = *(int *)((long)ida_mem + 0xa0);
                if (0 < (long)iVar2) {
                  lVar3 = 0;
                  do {
                    *(undefined8 *)
                     (*(long *)**(undefined8 **)((long)ida_mem + 0x6f8) + 8 + lVar3 * 8) =
                         *(undefined8 *)(*(long *)((long)ida_mem + 0x3a0) + lVar3 * 8);
                    *(undefined8 *)
                     (*(long *)**(undefined8 **)((long)ida_mem + 0x700) + 8 + lVar3 * 8) =
                         *(undefined8 *)(*(long *)((long)ida_mem + 0x388) + lVar3 * 8);
                    *(undefined8 *)
                     (*(long *)**(undefined8 **)((long)ida_mem + 0x708) + 8 + lVar3 * 8) =
                         *(undefined8 *)(*(long *)((long)ida_mem + 0x380) + lVar3 * 8);
                    lVar3 = lVar3 + 1;
                  } while (iVar2 != lVar3);
                }
                if (*(long *)((long)ida_mem + 0x10) != 0) {
                  *(long *)((long)ida_mem + 0x730) = *(long *)((long)ida_mem + 0x10);
                  return 0;
                }
                msgfmt = "The DAE residual function is NULL";
                iVar4 = -0x16;
                error_code = -0x16;
                iVar2 = 0xbe;
              }
              else {
                msgfmt = "Setting maximum number of nonlinear iterations failed";
                iVar4 = -0x16;
                error_code = -0x16;
                iVar2 = 0x86;
              }
            }
            else {
              msgfmt = "Setting convergence test function failed";
              iVar4 = -0x16;
              error_code = -0x16;
              iVar2 = 0x7d;
            }
          }
          else {
            msgfmt = "Setting nonlinear system function failed";
            iVar4 = -0x16;
            error_code = -0x16;
            iVar2 = 0x73;
          }
        }
        else {
          msgfmt = "Sensitivity solution method is not IDA_SIMULTANEOUS";
          iVar4 = -0x16;
          error_code = -0x16;
          iVar2 = 0x5d;
        }
      }
      else {
        msgfmt = "NLS type must be SUNNONLINEARSOLVER_ROOTFIND";
        iVar4 = -0x16;
        error_code = -0x16;
        iVar2 = 0x4d;
      }
    }
  }
LAB_001289c0:
  IDAProcessError((IDAMem)ida_mem,error_code,iVar2,"IDASetNonlinearSolverSensSim",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_nls_sim.c"
                  ,msgfmt);
  return iVar4;
}

Assistant:

int IDASetNonlinearSolverSensSim(void* ida_mem, SUNNonlinearSolver NLS)
{
  IDAMem IDA_mem;
  int retval, is;

  /* return immediately if IDA memory is NULL */
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* return immediately if NLS memory is NULL */
  if (NLS == NULL)
  {
    IDAProcessError(NULL, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "NLS must be non-NULL");
    return (IDA_ILL_INPUT);
  }

  /* check for required nonlinear solver functions */
  if (NLS->ops->gettype == NULL || NLS->ops->solve == NULL ||
      NLS->ops->setsysfn == NULL)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "NLS does not support required operations");
    return (IDA_ILL_INPUT);
  }

  /* check for allowed nonlinear solver types */
  if (SUNNonlinSolGetType(NLS) != SUNNONLINEARSOLVER_ROOTFIND)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "NLS type must be SUNNONLINEARSOLVER_ROOTFIND");
    return (IDA_ILL_INPUT);
  }

  /* check that sensitivities were initialized */
  if (!(IDA_mem->ida_sensi))
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_NO_SENSI);
    return (IDA_ILL_INPUT);
  }

  /* check that the simultaneous corrector was selected */
  if (IDA_mem->ida_ism != IDA_SIMULTANEOUS)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Sensitivity solution method is not IDA_SIMULTANEOUS");
    return (IDA_ILL_INPUT);
  }

  /* free any existing nonlinear solver */
  if ((IDA_mem->NLSsim != NULL) && (IDA_mem->ownNLSsim))
  {
    retval = SUNNonlinSolFree(IDA_mem->NLSsim);
  }

  /* set SUNNonlinearSolver pointer */
  IDA_mem->NLSsim = NLS;

  /* Set NLS ownership flag. If this function was called to attach the default
     NLS, IDA will set the flag to SUNTRUE after this function returns. */
  IDA_mem->ownNLSsim = SUNFALSE;

  /* set the nonlinear residual function */
  retval = SUNNonlinSolSetSysFn(IDA_mem->NLSsim, idaNlsResidualSensSim);
  if (retval != IDA_SUCCESS)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Setting nonlinear system function failed");
    return (IDA_ILL_INPUT);
  }

  /* set convergence test function */
  retval = SUNNonlinSolSetConvTestFn(IDA_mem->NLSsim, idaNlsConvTestSensSim,
                                     ida_mem);
  if (retval != IDA_SUCCESS)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Setting convergence test function failed");
    return (IDA_ILL_INPUT);
  }

  /* set max allowed nonlinear iterations */
  retval = SUNNonlinSolSetMaxIters(IDA_mem->NLSsim, MAXIT);
  if (retval != IDA_SUCCESS)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Setting maximum number of nonlinear iterations failed");
    return (IDA_ILL_INPUT);
  }

  /* create vector wrappers if necessary */
  if (IDA_mem->simMallocDone == SUNFALSE)
  {
    IDA_mem->ypredictSim = N_VNewEmpty_SensWrapper(IDA_mem->ida_Ns + 1,
                                                   IDA_mem->ida_sunctx);
    if (IDA_mem->ypredictSim == NULL)
    {
      IDAProcessError(IDA_mem, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                      MSG_MEM_FAIL);
      return (IDA_MEM_FAIL);
    }

    IDA_mem->ycorSim = N_VNewEmpty_SensWrapper(IDA_mem->ida_Ns + 1,
                                               IDA_mem->ida_sunctx);
    if (IDA_mem->ycorSim == NULL)
    {
      N_VDestroy(IDA_mem->ypredictSim);
      IDAProcessError(IDA_mem, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                      MSG_MEM_FAIL);
      return (IDA_MEM_FAIL);
    }

    IDA_mem->ewtSim = N_VNewEmpty_SensWrapper(IDA_mem->ida_Ns + 1,
                                              IDA_mem->ida_sunctx);
    if (IDA_mem->ewtSim == NULL)
    {
      N_VDestroy(IDA_mem->ypredictSim);
      N_VDestroy(IDA_mem->ycorSim);
      IDAProcessError(IDA_mem, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                      MSG_MEM_FAIL);
      return (IDA_MEM_FAIL);
    }

    IDA_mem->simMallocDone = SUNTRUE;
  }

  /* attach vectors to vector wrappers */
  NV_VEC_SW(IDA_mem->ypredictSim, 0) = IDA_mem->ida_yypredict;
  NV_VEC_SW(IDA_mem->ycorSim, 0)     = IDA_mem->ida_ee;
  NV_VEC_SW(IDA_mem->ewtSim, 0)      = IDA_mem->ida_ewt;

  for (is = 0; is < IDA_mem->ida_Ns; is++)
  {
    NV_VEC_SW(IDA_mem->ypredictSim, is + 1) = IDA_mem->ida_yySpredict[is];
    NV_VEC_SW(IDA_mem->ycorSim, is + 1)     = IDA_mem->ida_eeS[is];
    NV_VEC_SW(IDA_mem->ewtSim, is + 1)      = IDA_mem->ida_ewtS[is];
  }

  /* Set the nonlinear system RES function */
  if (!(IDA_mem->ida_res))
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "The DAE residual function is NULL");
    return (IDA_ILL_INPUT);
  }
  IDA_mem->nls_res = IDA_mem->ida_res;

  return (IDA_SUCCESS);
}